

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O1

void __thiscall RVO::RVOSimulator::removeObstacle(RVOSimulator *this,size_t obstacleNo)

{
  pointer *pppOVar1;
  Obstacle *pOVar2;
  
  pOVar2 = (this->obstacles_).super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>.
           _M_impl.super__Vector_impl_data._M_start[obstacleNo];
  if (pOVar2 != (Obstacle *)0x0) {
    operator_delete(pOVar2,0x10);
  }
  (this->obstacles_).super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
  super__Vector_impl_data._M_start[obstacleNo] =
       (this->obstacles_).super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>.
       _M_impl.super__Vector_impl_data._M_finish[-1];
  pppOVar1 = &(this->obstacles_).
              super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppOVar1 = *pppOVar1 + -1;
  return;
}

Assistant:

void RVOSimulator::removeObstacle(size_t obstacleNo)
	{
		delete obstacles_[obstacleNo];
		obstacles_[obstacleNo] = obstacles_.back();
		obstacles_.pop_back();
	}